

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3ExprIdToTrueFalse(Expr *pExpr)

{
  uint uVar1;
  u32 uVar2;
  int iVar3;
  
  uVar1 = pExpr->flags;
  iVar3 = 0;
  if ((uVar1 & 0x4000800) == 0) {
    uVar2 = sqlite3IsTrueOrFalse((pExpr->u).zToken);
    iVar3 = 0;
    if (uVar2 != 0) {
      pExpr->op = 0xaa;
      pExpr->flags = uVar2 | uVar1;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIdToTrueFalse(Expr *pExpr){
  u32 v;
  assert( pExpr->op==TK_ID || pExpr->op==TK_STRING );
  if( !ExprHasProperty(pExpr, EP_Quoted|EP_IntValue)
   && (v = sqlite3IsTrueOrFalse(pExpr->u.zToken))!=0
  ){
    pExpr->op = TK_TRUEFALSE;
    ExprSetProperty(pExpr, v);
    return 1;
  }
  return 0;
}